

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

void * uv__reallocf(void *ptr,size_t size)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  
  if (size == 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    (*(code *)uv__allocator_3)(ptr);
    *piVar3 = iVar1;
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)(*(code *)uv__allocator_1)(ptr,size);
  }
  if (size != 0 && pvVar2 == (void *)0x0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    (*(code *)uv__allocator_3)(ptr);
    *piVar3 = iVar1;
  }
  return pvVar2;
}

Assistant:

void* uv__reallocf(void* ptr, size_t size) {
  void* newptr;

  newptr = uv__realloc(ptr, size);
  if (newptr == NULL)
    if (size > 0)
      uv__free(ptr);

  return newptr;
}